

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2.cpp
# Opt level: O3

error<idx2::idx2_err_code> __thiscall
idx2::InitFromBuffer(idx2 *this,idx2_file *Idx2,params *P,buffer *Buf)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  ulong uVar5;
  char cVar6;
  long lVar7;
  long *in_FS_OFFSET;
  error<idx2::idx2_err_code> eVar8;
  stref Dir;
  
  Dir.field_0._4_4_ = 0;
  Dir.field_0._0_4_ = (uint)(Idx2->DecodeSubbandSpacings).Arr[2].Capacity;
  Dir._8_8_ = Buf;
  SetDir(this,(idx2_file *)(Idx2->DecodeSubbandSpacings).Arr[2].Size,Dir);
  SetDownsamplingFactor((idx2_file *)this,(v3i *)&(Idx2->DecodeSubbandSpacings).Arr[1].Alloc);
  eVar8 = ReadMetaFileFromBuffer((idx2_file *)this,(buffer *)P);
  pcVar4 = eVar8.Msg;
  if (eVar8.Code == NoError) {
    eVar8 = Finalize((idx2_file *)this,(params *)Idx2);
    pcVar4 = eVar8.Msg;
    if (eVar8.Code == NoError) {
      if (((Idx2->DecodeSubbandSpacings).Arr[1].Capacity & 0x7fffffffffffffffU) == 0) {
        uVar1 = *(uint *)(this + 0x80);
        uVar2 = *(uint *)(this + 0x84);
        uVar3 = *(uint *)(this + 0x88);
        (Idx2->DecodeSubbandSpacings).Arr[1].Size = 0;
        (Idx2->DecodeSubbandSpacings).Arr[1].Capacity =
             (ulong)(uVar3 & 0x1fffff) << 0x2a |
             ((ulong)uVar2 & 0x1fffff) << 0x15 | (ulong)uVar1 & 0x1fffff;
      }
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/idx2.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x12;
      pcVar4 = "";
      uVar5 = 0;
      goto LAB_00109a65;
    }
    uVar5 = eVar8._8_8_ >> 8 & 0xffffff;
    cVar6 = (char)uVar5;
    if ('?' < cVar6) {
      __assert_fail("false && \"stack too deep\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/idx2.cpp"
                    ,0xe,
                    "auto idx2::InitFromBuffer(idx2_file *, params &, buffer &)::(anonymous class)::operator()() const"
                   );
    }
    uVar1 = eVar8._8_4_ & 0xff00ff | ((int)uVar5 + 1U & 0xff) << 8;
    lVar7 = (long)cVar6;
    *(undefined4 *)(*in_FS_OFFSET + -0x97c + lVar7 * 4) = 0xe;
  }
  else {
    uVar5 = eVar8._8_8_ >> 8 & 0xffffff;
    cVar6 = (char)uVar5;
    if ('?' < cVar6) {
      __assert_fail("false && \"stack too deep\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/idx2.cpp"
                    ,0xd,
                    "auto idx2::InitFromBuffer(idx2_file *, params &, buffer &)::(anonymous class)::operator()() const"
                   );
    }
    uVar1 = eVar8._8_4_ & 0xff00ff | ((int)uVar5 + 1U & 0xff) << 8;
    lVar7 = (long)cVar6;
    *(undefined4 *)(*in_FS_OFFSET + -0x97c + lVar7 * 4) = 0xd;
  }
  uVar5 = (ulong)uVar1;
  *(char **)(*in_FS_OFFSET + -0xb78 + lVar7 * 8) =
       "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/idx2.cpp";
LAB_00109a65:
  eVar8.Code = (char)uVar5;
  eVar8.StackIdx = (char)(uVar5 >> 8);
  eVar8.StrGened = (bool)(char)(uVar5 >> 0x10);
  eVar8._11_5_ = (int5)(uVar5 >> 0x18);
  eVar8.Msg = pcVar4;
  return eVar8;
}

Assistant:

error<idx2_err_code>
InitFromBuffer(idx2_file* Idx2, params& P, buffer& Buf)
{
  SetDir(Idx2, P.InDir);
  SetDownsamplingFactor(Idx2, P.DownsamplingFactor3);
  idx2_PropagateIfError(ReadMetaFileFromBuffer(Idx2, Buf));
  idx2_PropagateIfError(Finalize(Idx2, &P));
  if (Dims(P.DecodeExtent) == v3i(0)) // TODO: this could conflate with the user wanting to decode a
                                      // single sample (very unlikely though)
    P.DecodeExtent = extent(Idx2->Dims3);
  return idx2_Error(idx2_err_code::NoError);
}